

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O3

int AF_AActor_GetDefaultSpeed
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  PClass *pPVar1;
  int iVar2;
  PClass *pPVar3;
  char *__assertion;
  PType *pPVar4;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
  }
  else {
    if ((param->field_0).field_3.Type == '\x03') {
      pPVar1 = (PClass *)(param->field_0).field_1.a;
      if ((param->field_0).field_1.atag == 1) {
        if (pPVar1 == (PClass *)0x0) {
          pPVar4 = (PType *)0x0;
        }
        else {
          pPVar3 = pPVar1;
          if (pPVar1 != AActor::RegistrationInfo.MyClass) {
            do {
              pPVar3 = pPVar3->ParentClass;
              if (pPVar3 == AActor::RegistrationInfo.MyClass) break;
            } while (pPVar3 != (PClass *)0x0);
            if (pPVar3 == (PClass *)0x0) {
              __assertion = "type == NULL || type->IsDescendantOf(RUNTIME_CLASS(AActor))";
              goto LAB_0042fecf;
            }
          }
          iVar2 = G_SkillProperty(SKILLP_FastMonsters);
          if ((iVar2 == 0) ||
             (pPVar4 = pPVar1[1].super_PNativeStruct.super_PStruct.super_PNamedType.
                       super_PCompoundType.super_PType.PredType, (double)pPVar4 < 0.0)) {
            pPVar4 = *(PType **)(pPVar1->Defaults + 0xe0);
          }
        }
LAB_0042fea4:
        if (numret < 1) {
          iVar2 = 0;
        }
        else {
          if (ret == (VMReturn *)0x0) {
            __assert_fail("ret != nullptr",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                          ,0x190b,
                          "int AF_AActor_GetDefaultSpeed(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          if (ret->RegType != '\x01') {
            __assert_fail("RegType == REGT_FLOAT",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/vm/vm.h"
                          ,0x144,"void VMReturn::SetFloat(double)");
          }
          *(PType **)ret->Location = pPVar4;
          iVar2 = 1;
        }
        return iVar2;
      }
      pPVar4 = (PType *)0x0;
      if (pPVar1 == (PClass *)0x0) goto LAB_0042fea4;
    }
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_0042fecf:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                ,0x190a,
                "int AF_AActor_GetDefaultSpeed(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
  ;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, GetDefaultSpeed)
{
	PARAM_PROLOGUE;
	PARAM_CLASS(type, AActor);
	ACTION_RETURN_FLOAT(GetDefaultSpeed(type));
}